

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

tdefl_sym_freq *
tdefl_radix_sort_syms(mz_uint num_syms,tdefl_sym_freq *pSyms0,tdefl_sym_freq *pSyms1)

{
  ushort uVar1;
  tdefl_sym_freq *ptVar2;
  tdefl_sym_freq *ptVar3;
  uint uVar4;
  uint uVar5;
  tdefl_sym_freq *in_RDX;
  tdefl_sym_freq *in_RSI;
  ulong uVar6;
  uint in_EDI;
  bool bVar7;
  tdefl_sym_freq *t;
  mz_uint cur_ofs;
  mz_uint offsets [256];
  mz_uint32 *pHist;
  mz_uint freq;
  tdefl_sym_freq *pNew_syms;
  tdefl_sym_freq *pCur_syms;
  mz_uint32 hist [512];
  mz_uint32 i;
  mz_uint32 pass;
  mz_uint32 pass_shift;
  mz_uint32 total_passes;
  uint local_c4c;
  uint auStack_c48 [256];
  uint *local_848;
  uint local_83c;
  tdefl_sym_freq *local_838;
  tdefl_sym_freq *local_830;
  uint local_828 [512];
  uint local_28;
  uint local_24;
  int local_20;
  uint local_1c;
  tdefl_sym_freq *local_10;
  uint local_4;
  
  local_1c = 2;
  local_838 = in_RDX;
  local_830 = in_RSI;
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(local_828,0,0x800);
  for (local_28 = 0; local_28 < local_4; local_28 = local_28 + 1) {
    uVar1 = local_10[local_28].m_key;
    local_83c = (uint)uVar1;
    uVar4 = uVar1 & 0xff;
    local_828[uVar4] = local_828[uVar4] + 1;
    uVar4 = (uVar1 >> 8) + 0x100;
    local_828[uVar4] = local_828[uVar4] + 1;
  }
  while( true ) {
    bVar7 = false;
    if (1 < local_1c) {
      bVar7 = local_4 == local_828[(local_1c - 1) * 0x100];
    }
    if (!bVar7) break;
    local_1c = local_1c - 1;
  }
  local_20 = 0;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    local_848 = local_828 + (local_24 << 8);
    local_c4c = 0;
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      auStack_c48[local_28] = local_c4c;
      local_c4c = (local_828 + (local_24 << 8))[local_28] + local_c4c;
    }
    for (local_28 = 0; ptVar3 = local_830, ptVar2 = local_838, local_28 < local_4;
        local_28 = local_28 + 1) {
      uVar6 = (ulong)local_28;
      uVar5 = (int)(uint)local_830[local_28].m_key >> ((byte)local_20 & 0x1f) & 0xff;
      uVar4 = auStack_c48[(int)uVar5];
      auStack_c48[(int)uVar5] = uVar4 + 1;
      ptVar2[uVar4] = ptVar3[uVar6];
    }
    local_830 = local_838;
    local_838 = ptVar3;
    local_20 = local_20 + 8;
  }
  return local_830;
}

Assistant:

static tdefl_sym_freq* tdefl_radix_sort_syms(mz_uint num_syms, tdefl_sym_freq* pSyms0, tdefl_sym_freq* pSyms1) {
  mz_uint32 total_passes = 2, pass_shift, pass, i, hist[256 * 2];
  tdefl_sym_freq *pCur_syms = pSyms0, *pNew_syms = pSyms1;
  MZ_CLEAR_OBJ(hist);
  for (i = 0; i < num_syms; i++) {
    mz_uint freq = pSyms0[i].m_key;
    hist[freq & 0xFF]++;
    hist[256 + ((freq >> 8) & 0xFF)]++;
  }
  while ((total_passes > 1) && (num_syms == hist[(total_passes - 1) * 256]))
    total_passes--;
  for (pass_shift = 0, pass = 0; pass < total_passes; pass++, pass_shift += 8) {
    const mz_uint32* pHist = &hist[pass << 8];
    mz_uint offsets[256], cur_ofs = 0;
    for (i = 0; i < 256; i++) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];
    }
    for (i = 0; i < num_syms; i++)
      pNew_syms[offsets[(pCur_syms[i].m_key >> pass_shift) & 0xFF]++] = pCur_syms[i];
    {
      tdefl_sym_freq* t = pCur_syms;
      pCur_syms = pNew_syms;
      pNew_syms = t;
    }
  }
  return pCur_syms;
}